

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaONE1(char *fileName,Rgba *pixels,int width,int height,int tileWidth,
                       int tileHeight)

{
  LevelRoundingMode in_ECX;
  RgbaChannels in_ESI;
  V2f *in_RDI;
  LevelMode in_R9D;
  LineOrder unaff_retaddr;
  Compression in_stack_00000008;
  int in_stack_00000010;
  TiledRgbaOutputFile out;
  int in_stack_ffffffffffffff3c;
  int dyMax;
  int in_stack_ffffffffffffff44;
  int dxMax;
  int in_stack_ffffffffffffff4c;
  TiledRgbaOutputFile *this;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  TiledOutputFile *in_stack_ffffffffffffffc8;
  ToYa *in_stack_ffffffffffffffd0;
  
  this = (TiledRgbaOutputFile *)&stack0xffffffffffffffc0;
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)this,0.0,0.0);
  Imf_2_5::globalThreadCount();
  dxMax = 0xf;
  dyMax = 0;
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8,in_R9D,in_ECX,in_ESI,in_stack_ffffffffffffffb4,in_RDI,
             in_stack_ffffffffffffffb0,unaff_retaddr,in_stack_00000008,in_stack_00000010);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
            ((TiledRgbaOutputFile *)CONCAT44(width,height),(Rgba *)CONCAT44(tileWidth,tileHeight),
             (size_t)out._toYa,(size_t)out._outputFile);
  Imf_2_5::TiledRgbaOutputFile::numXTiles
            ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff44,dyMax),
             in_stack_ffffffffffffff3c);
  Imf_2_5::TiledRgbaOutputFile::numYTiles
            ((TiledRgbaOutputFile *)CONCAT44(in_stack_ffffffffffffff44,dyMax),
             in_stack_ffffffffffffff3c);
  Imf_2_5::TiledRgbaOutputFile::writeTiles
            (this,in_stack_ffffffffffffff4c,dxMax,in_stack_ffffffffffffff44,dyMax,
             in_stack_ffffffffffffff3c);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(this);
  return;
}

Assistant:

void
writeTiledRgbaONE1 (const char fileName[],
                    const Rgba *pixels,
                    int width, int height,
                    int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with one level using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (fileName,
                             width, height,		// image size
                             tileWidth, tileHeight,	// tile size
                             ONE_LEVEL,			// level mode
			     ROUND_DOWN,		// rounding mode
                             WRITE_RGBA);		// channels in file

    out.setFrameBuffer (pixels, 1, width);
    out.writeTiles (0, out.numXTiles() - 1, 0, out.numYTiles() - 1);
}